

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlDOMWrapReconcileNamespaces(xmlDOMWrapCtxtPtr_conflict ctxt,xmlNodePtr elem,int options)

{
  xmlChar *str2;
  _xmlDoc *p_Var1;
  xmlNsMapItemPtr pxVar2;
  bool bVar3;
  bool bVar4;
  xmlElementType xVar5;
  int iVar6;
  xmlNsMapItemPtr_conflict pxVar7;
  _xmlNs *p_Var8;
  xmlNsPtr *ppxVar9;
  xmlNs *pxVar10;
  _xmlNode *p_Var11;
  xmlNsMapItemPtr pxVar12;
  xmlNsPtr pxVar13;
  int iVar14;
  uint uVar15;
  _xmlNode *elem_00;
  _xmlNode *p_Var16;
  xmlNsPtr *ppxVar17;
  uint uVar18;
  xmlNsMapPtr nsMap;
  int nbRedund;
  xmlNsPtr *listRedund;
  int sizeRedund;
  int in_stack_ffffffffffffff80;
  xmlNsMapItemPtr local_78;
  xmlNs *local_70;
  int local_64;
  undefined8 local_60;
  xmlNsPtr *local_58;
  int local_50;
  int local_4c;
  xmlNodePtr local_48;
  _xmlDoc *local_40;
  xmlNs *local_38;
  
  local_50 = options;
  local_78 = (xmlNsMapItemPtr)0x0;
  local_58 = (xmlNsPtr *)0x0;
  local_4c = 0;
  local_64 = 0;
  if (((elem == (xmlNodePtr)0x0) || (elem->doc == (_xmlDoc *)0x0)) ||
     (elem->type != XML_ELEMENT_NODE)) {
    return -1;
  }
  local_40 = elem->doc;
  iVar14 = -1;
  local_60 = 0;
  xVar5 = XML_ELEMENT_NODE;
  elem_00 = (_xmlNode *)0x0;
  uVar15 = 0;
  p_Var16 = elem;
  do {
    if (xVar5 == XML_ATTRIBUTE_NODE) {
LAB_0014eca9:
      if (p_Var16->ns != (xmlNs *)0x0) {
        if ((int)local_60 == 0) {
          p_Var1 = (_xmlDoc *)elem->parent;
          local_60 = 1;
          if (((p_Var1 != (_xmlDoc *)0x0) && (p_Var1->doc != p_Var1)) &&
             (iVar6 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_78,(xmlNodePtr)p_Var1),
             iVar6 == -1)) {
            uVar15 = 0xffffffff;
          }
        }
        if ((local_58 != (xmlNsPtr *)0x0) && (0 < local_64)) {
          ppxVar9 = local_58 + 1;
          iVar6 = local_64;
          do {
            if (p_Var16->ns == ppxVar9[-1]) {
              p_Var16->ns = *ppxVar9;
              break;
            }
            ppxVar9 = ppxVar9 + 2;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        if (local_78 != (xmlNsMapItemPtr)0x0) {
          for (pxVar7 = local_78->next; pxVar7 != (xmlNsMapItemPtr_conflict)0x0;
              pxVar7 = pxVar7->next) {
            if ((pxVar7->shadowDepth == -1) && (p_Var16->ns == pxVar7->oldNs)) {
              ppxVar9 = &pxVar7->newNs;
              goto LAB_0014ed75;
            }
          }
        }
        ppxVar9 = &local_70;
        iVar6 = xmlDOMWrapNSNormAcquireNormalizedNs
                          (local_40,elem_00,p_Var16->ns,ppxVar9,(xmlNsMapPtr *)&local_78,iVar14,
                           (uint)(p_Var16->type == XML_ATTRIBUTE_NODE),in_stack_ffffffffffffff80);
        if (iVar6 == -1) {
          uVar15 = 0xffffffff;
        }
LAB_0014ed75:
        p_Var16->ns = *ppxVar9;
      }
    }
    else {
      if (xVar5 != XML_ELEMENT_NODE) goto LAB_0014eda6;
      iVar14 = iVar14 + 1;
      elem_00 = p_Var16;
      if (p_Var16->nsDef == (xmlNs *)0x0) goto LAB_0014eca9;
      bVar3 = true;
      pxVar10 = (xmlNs *)0x0;
      local_70 = p_Var16->nsDef;
      local_48 = elem;
      do {
        local_38 = pxVar10;
        if ((int)local_60 == 0) {
          p_Var1 = (_xmlDoc *)local_48->parent;
          local_60 = 1;
          if (((p_Var1 != (_xmlDoc *)0x0) && (p_Var1->doc != p_Var1)) &&
             (iVar6 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_78,(xmlNodePtr)p_Var1),
             iVar6 == -1)) {
            uVar15 = 0xffffffff;
          }
        }
        if ((local_78 != (xmlNsMapItemPtr)0x0 & (byte)local_50) == 1) {
          for (pxVar7 = local_78->next; pxVar7 != (xmlNsMapItemPtr_conflict)0x0;
              pxVar7 = pxVar7->next) {
            uVar18 = uVar15;
            if ((-2 < pxVar7->depth) && (pxVar7->shadowDepth == -1)) {
              pxVar13 = pxVar7->newNs;
              if (local_70->prefix != pxVar13->prefix) {
                iVar6 = xmlStrEqual(local_70->prefix,pxVar13->prefix);
                if (iVar6 == 0) goto LAB_0014eb0a;
                pxVar13 = pxVar7->newNs;
              }
              if (local_70->href != pxVar13->href) {
                iVar6 = xmlStrEqual(local_70->href,pxVar13->href);
                if (iVar6 == 0) goto LAB_0014eb0a;
                pxVar13 = pxVar7->newNs;
              }
              iVar6 = xmlDOMWrapNSNormAddNsMapItem2(&local_58,&local_4c,&local_64,local_70,pxVar13);
              uVar18 = 0xffffffff;
              if (iVar6 != -1) {
                p_Var8 = local_70->next;
                if (local_38 == (xmlNs *)0x0) {
                  p_Var16->nsDef = p_Var8;
                  pxVar10 = (xmlNs *)0x0;
                  goto LAB_0014ec7d;
                }
                local_38->next = p_Var8;
                pxVar10 = local_38;
                goto LAB_0014ec7a;
              }
            }
LAB_0014eb0a:
            uVar15 = uVar18;
          }
        }
        bVar4 = bVar3 && p_Var16->ns != local_70;
        if (p_Var16->ns == (xmlNs *)0x0) {
          bVar4 = bVar3;
        }
        bVar3 = bVar4;
        if (local_78 != (xmlNsMapItemPtr)0x0) {
          for (pxVar7 = local_78->next; pxVar7 != (xmlNsMapItemPtr_conflict)0x0;
              pxVar7 = pxVar7->next) {
            if ((-2 < pxVar7->depth) && (pxVar7->shadowDepth == -1)) {
              str2 = pxVar7->newNs->prefix;
              if ((local_70->prefix == str2) ||
                 (iVar6 = xmlStrEqual(local_70->prefix,str2), iVar6 != 0)) {
                pxVar7->shadowDepth = iVar14;
              }
            }
          }
        }
        pxVar7 = xmlDOMWrapNsMapAddItem((xmlNsMapPtr *)&local_78,-1,local_70,local_70,iVar14);
        uVar15 = -(uint)(pxVar7 == (xmlNsMapItemPtr_conflict)0x0) | uVar15;
        pxVar10 = local_70;
LAB_0014ec7a:
        p_Var8 = local_70->next;
LAB_0014ec7d:
        local_70 = p_Var8;
      } while (p_Var8 != (_xmlNs *)0x0);
      elem = local_48;
      if (bVar3) goto LAB_0014eca9;
    }
    if (p_Var16->type != XML_ELEMENT_NODE) goto LAB_0014eda6;
    p_Var11 = (_xmlNode *)p_Var16->properties;
    if (p_Var11 == (_xmlNode *)0x0) {
      while (p_Var11 = p_Var16->children, p_Var11 == (_xmlNode *)0x0) {
LAB_0014eda6:
        do {
          ppxVar9 = local_58;
          if (p_Var16 == elem) {
            if (local_58 != (xmlNsPtr *)0x0) {
              ppxVar17 = local_58;
              iVar14 = local_64;
              if (0 < local_64) {
                do {
                  xmlFreeNs(*ppxVar17);
                  iVar14 = iVar14 + -1;
                  ppxVar17 = ppxVar17 + 2;
                } while (iVar14 != 0);
              }
              (*xmlFree)(ppxVar9);
            }
            if (local_78 == (xmlNsMapItemPtr)0x0) {
              return uVar15;
            }
            xmlDOMWrapNsMapFree((xmlNsMapPtr)local_78);
            return uVar15;
          }
          xVar5 = p_Var16->type;
          if (xVar5 == XML_ELEMENT_NODE) {
            if ((local_78 != (xmlNsMapItemPtr)0x0) &&
               (pxVar7 = local_78->next, pxVar7 != (xmlNsMapItemPtr_conflict)0x0)) {
              pxVar13 = (xmlNsPtr)local_78->prev;
              if (pxVar13 == (xmlNsPtr)0x0) goto LAB_0014ee18;
              do {
                if (*(int *)((long)&pxVar13->_private + 4) < iVar14) break;
                pxVar2 = *(xmlNsMapItemPtr *)&pxVar13->type;
                local_78->prev = pxVar2;
                pxVar12 = local_78;
                if (pxVar2 != (xmlNsMapItemPtr)0x0) {
                  pxVar12 = pxVar2;
                }
                pxVar12->next = (xmlNsMapItemPtr_conflict)0x0;
                pxVar13->next = local_78->oldNs;
                local_78->oldNs = pxVar13;
                pxVar13 = (xmlNsPtr)local_78->prev;
              } while (pxVar13 != (xmlNsPtr)0x0);
              for (pxVar7 = local_78->next; pxVar7 != (xmlNsMapItemPtr)0x0; pxVar7 = pxVar7->next) {
LAB_0014ee18:
                if (iVar14 <= pxVar7->shadowDepth) {
                  pxVar7->shadowDepth = -1;
                }
              }
            }
            iVar14 = iVar14 + -1;
          }
          p_Var11 = p_Var16->next;
          if (p_Var11 != (_xmlNode *)0x0) goto LAB_0014ed8c;
          p_Var16 = p_Var16->parent;
        } while ((xVar5 != XML_ATTRIBUTE_NODE) || (p_Var16->type != XML_ELEMENT_NODE));
      }
    }
LAB_0014ed8c:
    xVar5 = p_Var11->type;
    p_Var16 = p_Var11;
  } while( true );
}

Assistant:

int
xmlDOMWrapReconcileNamespaces(xmlDOMWrapCtxtPtr ctxt ATTRIBUTE_UNUSED,
			      xmlNodePtr elem,
			      int options)
{
    int depth = -1, adoptns = 0, parnsdone = 0;
    xmlNsPtr ns, prevns;
    xmlDocPtr doc;
    xmlNodePtr cur, curElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr /* topmi = NULL, */ mi;
    /* @ancestorsOnly should be set by an option flag. */
    int ancestorsOnly = 0;
    int optRemoveRedundantNS =
	((xmlDOMReconcileNSOptions) options & XML_DOM_RECONNS_REMOVEREDUND) ? 1 : 0;
    xmlNsPtr *listRedund = NULL;
    int sizeRedund = 0, nbRedund = 0, ret = 0, i, j;

    if ((elem == NULL) || (elem->doc == NULL) ||
	(elem->type != XML_ELEMENT_NODE))
	return (-1);

    doc = elem->doc;
    cur = elem;
    do {
	switch (cur->type) {
	    case XML_ELEMENT_NODE:
		adoptns = 1;
		curElem = cur;
		depth++;
		/*
		* Namespace declarations.
		*/
		if (cur->nsDef != NULL) {
		    prevns = NULL;
		    ns = cur->nsDef;
		    while (ns != NULL) {
			if (! parnsdone) {
			    if ((elem->parent) &&
				((xmlNodePtr) elem->parent->doc != elem->parent)) {
				/*
				* Gather ancestor in-scope ns-decls.
				*/
				if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				    elem->parent) == -1)
				    ret = -1;
			    }
			    parnsdone = 1;
			}

			/*
			* Lookup the ns ancestor-axis for equal ns-decls in scope.
			*/
			if (optRemoveRedundantNS && XML_NSMAP_NOTEMPTY(nsMap)) {
			    XML_NSMAP_FOREACH(nsMap, mi) {
				if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
				    (mi->shadowDepth == -1) &&
				    ((ns->prefix == mi->newNs->prefix) ||
				      xmlStrEqual(ns->prefix, mi->newNs->prefix)) &&
				    ((ns->href == mi->newNs->href) ||
				      xmlStrEqual(ns->href, mi->newNs->href)))
				{
				    /*
				    * A redundant ns-decl was found.
				    * Add it to the list of redundant ns-decls.
				    */
				    if (xmlDOMWrapNSNormAddNsMapItem2(&listRedund,
					&sizeRedund, &nbRedund, ns, mi->newNs) == -1) {
					ret = -1;
                                    } else {
                                        /*
                                        * Remove the ns-decl from the element-node.
                                        */
                                        if (prevns)
                                            prevns->next = ns->next;
                                        else
                                            cur->nsDef = ns->next;
                                        goto next_ns_decl;
                                    }
				}
			    }
			}

			/*
			* Skip ns-references handling if the referenced
			* ns-decl is declared on the same element.
			*/
			if ((cur->ns != NULL) && adoptns && (cur->ns == ns))
			    adoptns = 0;
			/*
			* Does it shadow any ns-decl?
			*/
			if (XML_NSMAP_NOTEMPTY(nsMap)) {
			    XML_NSMAP_FOREACH(nsMap, mi) {
				if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
				    (mi->shadowDepth == -1) &&
				    ((ns->prefix == mi->newNs->prefix) ||
				    xmlStrEqual(ns->prefix, mi->newNs->prefix))) {

				    mi->shadowDepth = depth;
				}
			    }
			}
			/*
			* Push mapping.
			*/
			if (xmlDOMWrapNsMapAddItem(&nsMap, -1, ns, ns,
			    depth) == NULL)
			    ret = -1;

			prevns = ns;
next_ns_decl:
			ns = ns->next;
		    }
		}
		if (! adoptns)
		    goto ns_end;
                /* Falls through. */
	    case XML_ATTRIBUTE_NODE:
		/* No ns, no fun. */
		if (cur->ns == NULL)
		    goto ns_end;

		if (! parnsdone) {
		    if ((elem->parent) &&
			((xmlNodePtr) elem->parent->doc != elem->parent)) {
			if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				elem->parent) == -1)
			    ret = -1;
		    }
		    parnsdone = 1;
		}
		/*
		* Adjust the reference if this was a redundant ns-decl.
		*/
		if (listRedund) {
		   for (i = 0, j = 0; i < nbRedund; i++, j += 2) {
		       if (cur->ns == listRedund[j]) {
			   cur->ns = listRedund[++j];
			   break;
		       }
		   }
		}
		/*
		* Adopt ns-references.
		*/
		if (XML_NSMAP_NOTEMPTY(nsMap)) {
		    /*
		    * Search for a mapping.
		    */
		    XML_NSMAP_FOREACH(nsMap, mi) {
			if ((mi->shadowDepth == -1) &&
			    (cur->ns == mi->oldNs)) {

			    cur->ns = mi->newNs;
			    goto ns_end;
			}
		    }
		}
		/*
		* Acquire a normalized ns-decl and add it to the map.
		*/
		if (xmlDOMWrapNSNormAcquireNormalizedNs(doc, curElem,
			cur->ns, &ns,
			&nsMap, depth,
			ancestorsOnly,
			(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
		    ret = -1;
		cur->ns = ns;

ns_end:
		if ((cur->type == XML_ELEMENT_NODE) &&
		    (cur->properties != NULL)) {
		    /*
		    * Process attributes.
		    */
		    cur = (xmlNodePtr) cur->properties;
		    continue;
		}
		break;
	    default:
		goto next_sibling;
	}
into_content:
	if ((cur->type == XML_ELEMENT_NODE) &&
	    (cur->children != NULL)) {
	    /*
	    * Process content of element-nodes only.
	    */
	    cur = cur->children;
	    continue;
	}
next_sibling:
	if (cur == elem)
	    break;
	if (cur->type == XML_ELEMENT_NODE) {
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL)
	    cur = cur->next;
	else {
	    if (cur->type == XML_ATTRIBUTE_NODE) {
		cur = cur->parent;
		goto into_content;
	    }
	    cur = cur->parent;
	    goto next_sibling;
	}
    } while (cur != NULL);

    if (listRedund) {
	for (i = 0, j = 0; i < nbRedund; i++, j += 2) {
	    xmlFreeNs(listRedund[j]);
	}
	xmlFree(listRedund);
    }
    if (nsMap != NULL)
	xmlDOMWrapNsMapFree(nsMap);
    return (ret);
}